

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::Generator::FieldReferencingExpression
          (Generator *this,Descriptor *containing_type,FieldDescriptor *field,
          string *python_dict_name)

{
  FileDescriptor *pFVar1;
  FieldDescriptor *in_RCX;
  long in_RDX;
  long in_RSI;
  string *in_RDI;
  LogMessage *in_stack_fffffffffffffce8;
  LogMessage *in_stack_fffffffffffffcf0;
  undefined8 in_stack_fffffffffffffcf8;
  LogLevel level;
  LogMessage *in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd28;
  SubstituteArg *in_stack_fffffffffffffd38;
  LogMessage *in_stack_fffffffffffffd40;
  LogMessage *in_stack_fffffffffffffd48;
  SubstituteArg *in_stack_fffffffffffffd50;
  FileDescriptor *in_stack_fffffffffffffd58;
  SubstituteArg *in_stack_fffffffffffffd90;
  SubstituteArg *in_stack_fffffffffffffd98;
  SubstituteArg *in_stack_fffffffffffffda0;
  SubstituteArg *in_stack_fffffffffffffda8;
  SubstituteArg *in_stack_fffffffffffffdb0;
  SubstituteArg *in_stack_fffffffffffffdb8;
  Descriptor *in_stack_fffffffffffffdd0;
  Generator *in_stack_fffffffffffffdd8;
  SubstituteArg local_218;
  SubstituteArg local_1e8;
  SubstituteArg local_1b8;
  SubstituteArg local_188;
  SubstituteArg local_158 [3];
  string local_c8 [103];
  byte local_61;
  FieldDescriptor *local_20;
  long local_18;
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
  local_20 = in_RCX;
  local_18 = in_RDX;
  pFVar1 = FieldDescriptor::file(in_RCX);
  local_61 = 0;
  if (pFVar1 != *(FileDescriptor **)(in_RSI + 0x30)) {
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffd00,level,(char *)in_stack_fffffffffffffcf0,
               (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
    local_61 = 1;
    internal::LogMessage::operator<<(in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8);
    in_stack_fffffffffffffd58 = FieldDescriptor::file(local_20);
    in_stack_fffffffffffffd50 =
         (SubstituteArg *)FileDescriptor::name_abi_cxx11_(in_stack_fffffffffffffd58);
    in_stack_fffffffffffffd48 =
         internal::LogMessage::operator<<
                   (in_stack_fffffffffffffcf0,(string *)in_stack_fffffffffffffce8);
    in_stack_fffffffffffffd40 =
         internal::LogMessage::operator<<
                   (in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8);
    in_stack_fffffffffffffd38 =
         (SubstituteArg *)FileDescriptor::name_abi_cxx11_(*(FileDescriptor **)(in_RSI + 0x30));
    internal::LogMessage::operator<<(in_stack_fffffffffffffcf0,(string *)in_stack_fffffffffffffce8);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x4c3666);
  }
  if (local_18 == 0) {
    FieldDescriptor::name_abi_cxx11_(local_20);
    anon_unknown_0::ResolveKeyword(in_stack_fffffffffffffd28);
  }
  else {
    ModuleLevelDescriptorName<google::protobuf::Descriptor>
              (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    strings::internal::SubstituteArg::SubstituteArg
              ((SubstituteArg *)in_stack_fffffffffffffcf0,(string *)in_stack_fffffffffffffce8);
    strings::internal::SubstituteArg::SubstituteArg
              ((SubstituteArg *)in_stack_fffffffffffffcf0,(string *)in_stack_fffffffffffffce8);
    FieldDescriptor::name_abi_cxx11_(local_20);
    strings::internal::SubstituteArg::SubstituteArg
              ((SubstituteArg *)in_stack_fffffffffffffcf0,(string *)in_stack_fffffffffffffce8);
    strings::internal::SubstituteArg::SubstituteArg(local_158);
    strings::internal::SubstituteArg::SubstituteArg(&local_188);
    strings::internal::SubstituteArg::SubstituteArg(&local_1b8);
    strings::internal::SubstituteArg::SubstituteArg(&local_1e8);
    strings::internal::SubstituteArg::SubstituteArg(&local_218);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffffdb8);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffffd88);
    strings::Substitute_abi_cxx11_
              ((char *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
               (SubstituteArg *)in_stack_fffffffffffffd48,(SubstituteArg *)in_stack_fffffffffffffd40
               ,in_stack_fffffffffffffd38,in_stack_fffffffffffffd90,in_stack_fffffffffffffd98,
               in_stack_fffffffffffffda0,in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0,
               in_stack_fffffffffffffdb8);
    std::__cxx11::string::~string(local_c8);
  }
  return in_RDI;
}

Assistant:

std::string Generator::FieldReferencingExpression(
    const Descriptor* containing_type, const FieldDescriptor& field,
    const std::string& python_dict_name) const {
  // We should only ever be looking up fields in the current file.
  // The only things we refer to from other files are message descriptors.
  GOOGLE_CHECK_EQ(field.file(), file_)
      << field.file()->name() << " vs. " << file_->name();
  if (!containing_type) {
    return ResolveKeyword(field.name());
  }
  return strings::Substitute("$0.$1['$2']",
                             ModuleLevelDescriptorName(*containing_type),
                             python_dict_name, field.name());
}